

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileStorage.cpp
# Opt level: O0

bool DynamicProfileStorage::ReleaseLock(void)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  bool local_9;
  
  if (!locked) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x2d0,"(locked)","locked");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (mutex == (HANDLE)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x2d1,"(mutex != nullptr)","mutex != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  locked = false;
  BVar3 = ReleaseMutex(mutex);
  if (BVar3 == 0) {
    DisableCacheDir();
    Output::Print(L"ERROR: DynamicProfileStorage: Unable to release mutex");
    Output::Flush();
  }
  local_9 = BVar3 != 0;
  return local_9;
}

Assistant:

bool DynamicProfileStorage::ReleaseLock()
{
    AssertOrFailFast(locked);
    AssertOrFailFast(mutex != nullptr);
#if DBG
    locked = false;
#endif
    if (ReleaseMutex(mutex))
    {
        return true;
    }
    DisableCacheDir();
    Output::Print(_u("ERROR: DynamicProfileStorage: Unable to release mutex"));
    Output::Flush();
    return false;
}